

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O0

LinkedList<data_structures::SymbolTableElement<int,_int>_> * __thiscall
data_structures::LinkedList<data_structures::SymbolTableElement<int,_int>_>::operator=
          (LinkedList<data_structures::SymbolTableElement<int,_int>_> *this,
          LinkedList<data_structures::SymbolTableElement<int,_int>_> *list)

{
  bool bVar1;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *this_00;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *local_30;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *_current;
  LinkedList<data_structures::SymbolTableElement<int,_int>_> *list_local;
  LinkedList<data_structures::SymbolTableElement<int,_int>_> *this_local;
  
  this_00 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)operator_new(0x20);
  ListNode<data_structures::SymbolTableElement<int,_int>_>::ListNode(this_00);
  this->_header = this_00;
  this->_tail = this->_header;
  this->_size = 0;
  local_30 = list->_header;
  while( true ) {
    bVar1 = isTail(list,local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_30 = ListNode<data_structures::SymbolTableElement<int,_int>_>::next(local_30);
    insertToTail(this,&local_30->element);
  }
  return this;
}

Assistant:

inline
    LinkedList<T>& LinkedList<T>::operator=(const LinkedList<T>& list) {
        _header = new ListNode<T>();
        _tail = _header;
        _size = 0;
        ListNode<T>* _current = list._header;
        while (!list.isTail(_current)) {
            _current = _current->next();
            insertToTail(_current->element);
        }
        return *this;
    }